

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

lua_State * lj_state_new(lua_State *L)

{
  TValue *__s;
  void *pvVar1;
  lua_State *plVar2;
  ulong *puVar3;
  
  plVar2 = (lua_State *)lj_mem_newgco(L,0x70);
  plVar2->gct = '\x06';
  plVar2->dummy_ffid = '\x01';
  plVar2->status = '\0';
  plVar2->stacksize = 0;
  plVar2->cframe = (void *)0x0;
  (plVar2->stack).ptr64 = 0;
  (plVar2->openupval).gcptr64 = 0;
  (plVar2->glref).ptr64 = (L->glref).ptr64;
  (plVar2->env).gcptr64 = (L->env).gcptr64;
  puVar3 = (ulong *)lj_mem_realloc(L,(void *)0x0,0,0x178);
  (plVar2->stack).ptr64 = (uint64_t)puVar3;
  plVar2->stacksize = 0x2f;
  (plVar2->maxstack).ptr64 = (uint64_t)(puVar3 + 0x27);
  *puVar3 = (ulong)plVar2 | 0xfffc800000000000;
  puVar3[1] = 0xffffffffffffffff;
  __s = (TValue *)(puVar3 + 2);
  plVar2->top = __s;
  plVar2->base = __s;
  memset(__s,0xff,0x168);
  pvVar1 = L->exdata2;
  plVar2->exdata = L->exdata;
  plVar2->exdata2 = pvVar1;
  return plVar2;
}

Assistant:

lua_State *lj_state_new(lua_State *L)
{
  lua_State *L1 = lj_mem_newobj(L, lua_State);
  L1->gct = ~LJ_TTHREAD;
  L1->dummy_ffid = FF_C;
  L1->status = LUA_OK;
  L1->stacksize = 0;
  setmref(L1->stack, NULL);
  L1->cframe = NULL;
  /* NOBARRIER: The lua_State is new (marked white). */
  setgcrefnull(L1->openupval);
  setmrefr(L1->glref, L->glref);
  setgcrefr(L1->env, L->env);
  stack_init(L1, L);  /* init stack */
  lj_assertL(iswhite(obj2gco(L1)), "new thread object is not white");
  L1->exdata = L->exdata;
  L1->exdata2 = L->exdata2;
  return L1;
}